

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O1

void av1_free_internal_frame_buffers(InternalFrameBufferList *list)

{
  long lVar1;
  long lVar2;
  
  if (0 < list->num_internal_frame_buffers) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      aom_free(*(void **)((long)&list->int_fb->data + lVar1));
      *(undefined8 *)((long)&list->int_fb->data + lVar1) = 0;
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < list->num_internal_frame_buffers);
  }
  aom_free(list->int_fb);
  list->int_fb = (InternalFrameBuffer *)0x0;
  list->num_internal_frame_buffers = 0;
  return;
}

Assistant:

void av1_free_internal_frame_buffers(InternalFrameBufferList *list) {
  int i;

  assert(list != NULL);

  for (i = 0; i < list->num_internal_frame_buffers; ++i) {
    aom_free(list->int_fb[i].data);
    list->int_fb[i].data = NULL;
  }
  aom_free(list->int_fb);
  list->int_fb = NULL;
  list->num_internal_frame_buffers = 0;
}